

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_list.c
# Opt level: O1

int main(void)

{
  list_test_item *elt;
  UpnpListIter pUVar1;
  UpnpListIter pUVar2;
  UpnpListIter pUVar3;
  int i;
  uint uVar4;
  UpnpListHead list;
  UpnpListHead UStack_38;
  
  UpnpListInit(&UStack_38);
  i = 0;
  do {
    elt = list_test_item__new(i);
    pUVar1 = UpnpListEnd(&UStack_38);
    UpnpListInsert(&UStack_38,pUVar1,&elt->list);
    i = i + 1;
  } while (i != 10);
  pUVar1 = UpnpListBegin(&UStack_38);
  pUVar2 = UpnpListEnd(&UStack_38);
  if (pUVar1 != pUVar2) {
    uVar4 = 0;
    do {
      printf("List item index: %i, expected: %i\n",(ulong)*(uint *)&pUVar1[1].next,(ulong)uVar4);
      if (uVar4 != *(uint *)&pUVar1[1].next) {
        __assert_fail("item->index == i","upnp/test/test_list.c",0x33,"int main(void)");
      }
      uVar4 = uVar4 + 1;
      pUVar1 = UpnpListNext(&UStack_38,pUVar1);
      pUVar2 = UpnpListEnd(&UStack_38);
    } while (pUVar1 != pUVar2);
  }
  pUVar1 = UpnpListBegin(&UStack_38);
  pUVar2 = UpnpListEnd(&UStack_38);
  if (pUVar1 == pUVar2) {
    __assert_fail("UpnpListBegin(&list) != UpnpListEnd(&list)","upnp/test/test_list.c",0x3b,
                  "int main(void)");
  }
  pUVar1 = UpnpListBegin(&UStack_38);
  pUVar2 = UpnpListEnd(&UStack_38);
  if (pUVar1 != pUVar2) {
    uVar4 = 0;
    do {
      printf("List item index: %i, expected: %i\n",(ulong)*(uint *)&pUVar1[1].next,(ulong)uVar4);
      if (uVar4 != *(uint *)&pUVar1[1].next) {
        __assert_fail("item->index == i","upnp/test/test_list.c",0x48,"int main(void)");
      }
      uVar4 = uVar4 + 1;
      pUVar2 = UpnpListErase(&UStack_38,pUVar1);
      free(pUVar1);
      pUVar3 = UpnpListEnd(&UStack_38);
      pUVar1 = pUVar2;
    } while (pUVar2 != pUVar3);
  }
  pUVar1 = UpnpListBegin(&UStack_38);
  pUVar2 = UpnpListEnd(&UStack_38);
  if (pUVar1 == pUVar2) {
    pUVar1 = UpnpListBegin(&UStack_38);
    pUVar2 = UpnpListNext(&UStack_38,pUVar1);
    pUVar3 = UpnpListEnd(&UStack_38);
    if (pUVar2 != pUVar3) {
      __assert_fail("UpnpListNext(&list, list_iter) == UpnpListEnd(&list)","upnp/test/test_list.c",
                    0x54,"int main(void)");
    }
    pUVar2 = UpnpListEnd(&UStack_38);
    if (pUVar1 == pUVar2) {
      return 0;
    }
    __assert_fail("list_iter == UpnpListEnd(&list)","upnp/test/test_list.c",0x55,"int main(void)");
  }
  __assert_fail("UpnpListBegin(&list) == UpnpListEnd(&list)","upnp/test/test_list.c",0x51,
                "int main(void)");
}

Assistant:

int main(void)
{
	int i;
	UpnpListHead list;
	UpnpListInit(&list);

	/* Fill list with items */
	for (i = 0; i < 10; i++) {
		struct list_test_item *item = list_test_item__new(i);

		UpnpListInsert(&list, UpnpListEnd(&list), &item->list);
	}

	/* Verify list contents */
	{
		int i = 0;
		UpnpListIter list_iter = UpnpListBegin(&list);
		while (list_iter != UpnpListEnd(&list)) {
			struct list_test_item *item =
				(struct list_test_item *)list_iter;

			printf("List item index: %i, expected: %i\n",
				item->index,
				i);
			assert(item->index == i);

			i++;
			list_iter = UpnpListNext(&list, list_iter);
		}
	}

	/* Verify list is still fine */
	assert(UpnpListBegin(&list) != UpnpListEnd(&list));

	/* Clear list */
	{
		int i = 0;
		UpnpListIter list_iter = UpnpListBegin(&list);
		while (list_iter != UpnpListEnd(&list)) {
			struct list_test_item *item =
				(struct list_test_item *)list_iter;

			printf("List item index: %i, expected: %i\n",
				item->index,
				i);
			assert(item->index == i);

			i++;
			list_iter = UpnpListErase(&list, list_iter);
			free(item);
		}
	}

	/* Verify list is cleared */
	assert(UpnpListBegin(&list) == UpnpListEnd(&list));

	UpnpListIter list_iter = UpnpListBegin(&list);
	assert(UpnpListNext(&list, list_iter) == UpnpListEnd(&list));
	assert(list_iter == UpnpListEnd(&list));

	return 0;
}